

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

bool __thiscall CUI::OnInput(CUI *this,CEvent *e)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  
  if (this->m_Enabled != true) {
    return false;
  }
  if ((CLineInput::s_pActiveInput != (CLineInput *)0x0) &&
     (bVar2 = CLineInput::ProcessInput(CLineInput::s_pActiveInput,e), bVar2)) {
    return true;
  }
  if ((e->m_Flags & 1) == 0) {
    return false;
  }
  uVar1 = this->m_HotkeysPressed;
  iVar4 = e->m_Key;
  if (iVar4 == 9) {
    iVar4 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166),
       (char)iVar4 == '\0')) {
      uVar3 = this->m_HotkeysPressed | 0x20;
    }
    else {
      iVar4 = e->m_Key;
LAB_0017e018:
      uVar3 = this->m_HotkeysPressed;
      if (iVar4 == 0xd2) {
        uVar3 = uVar3 | 4;
      }
      else if (iVar4 == 0xd1) {
        uVar3 = uVar3 | 8;
      }
      else {
        if (iVar4 != 0x7f) goto LAB_0017e048;
        uVar3 = uVar3 | 0x10;
      }
    }
  }
  else {
    if (iVar4 != 0xd8) {
      if (iVar4 == 0x1b) {
        uVar3 = uVar1 | 2;
        goto LAB_0017e045;
      }
      if (iVar4 != 0xd) goto LAB_0017e018;
    }
    uVar3 = uVar1 | 1;
  }
LAB_0017e045:
  this->m_HotkeysPressed = uVar3;
LAB_0017e048:
  return uVar1 != uVar3;
}

Assistant:

bool CUI::OnInput(const IInput::CEvent &e)
{
	if(!Enabled())
		return false;

	CLineInput *pActiveInput = CLineInput::GetActiveInput();
	if(pActiveInput && pActiveInput->ProcessInput(e))
		return true;

	if(e.m_Flags&IInput::FLAG_PRESS)
	{
		unsigned LastHotkeysPressed = m_HotkeysPressed;
		if(e.m_Key == KEY_RETURN || e.m_Key == KEY_KP_ENTER)
			m_HotkeysPressed |= HOTKEY_ENTER;
		else if(e.m_Key == KEY_ESCAPE)
			m_HotkeysPressed |= HOTKEY_ESCAPE;
		else if(e.m_Key == KEY_TAB && !Input()->KeyIsPressed(KEY_LALT) && !Input()->KeyIsPressed(KEY_RALT))
			m_HotkeysPressed |= HOTKEY_TAB;
		else if(e.m_Key == KEY_DELETE)
			m_HotkeysPressed |= HOTKEY_DELETE;
		else if(e.m_Key == KEY_UP)
			m_HotkeysPressed |= HOTKEY_UP;
		else if(e.m_Key == KEY_DOWN)
			m_HotkeysPressed |= HOTKEY_DOWN;
		return LastHotkeysPressed != m_HotkeysPressed;
	}
	return false;
}